

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

int __thiscall CLOptions::AsInt(CLOptions *this,string *param_name)

{
  int iVar1;
  size_type sVar2;
  mapped_type *ppCVar3;
  ostream *poVar4;
  
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
          ::count(&this->params_ints,param_name);
  if (sVar2 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"[ERROR] CLOptions::AsInt() :: Parameter \"");
    poVar4 = std::operator<<(poVar4,(string *)param_name);
    poVar4 = std::operator<<(poVar4,"\" is not an integer!");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = 0;
  }
  else {
    ppCVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
              ::operator[](&this->params_ints,param_name);
    iVar1 = *(int *)(*ppCVar3 + 0x50);
  }
  return iVar1;
}

Assistant:

int CLOptions::AsInt(const std::string& param_name)
{
    if (params_ints.count(param_name) == 0) {
        std::cerr << "[ERROR] CLOptions::AsInt() :: Parameter \"" << param_name << "\" is not an integer!" << std::endl;
        return 0 ;
    } else {
        return params_ints[param_name]->getValue();
    }
}